

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_struct_swap(t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *ptVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  pointer pptVar7;
  bool bVar8;
  string local_68;
  t_cpp_generator *local_48;
  ostream *local_40;
  pointer local_38;
  
  local_48 = this;
  local_40 = out;
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar5));
  if (iVar5 == 0) {
LAB_001851de:
    t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"void swap(",10);
    iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,*(char **)CONCAT44(extraout_var_03,iVar5),
                        ((undefined8 *)CONCAT44(extraout_var_03,iVar5))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," &a1, ",6);
    iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,*(char **)CONCAT44(extraout_var_04,iVar5),
                        ((undefined8 *)CONCAT44(extraout_var_04,iVar5))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," &a2) {",7);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_00,iVar5));
    if (iVar5 == 0) goto LAB_001851de;
    t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"void swap(",10);
    iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,*(char **)CONCAT44(extraout_var_01,iVar5),
                        ((undefined8 *)CONCAT44(extraout_var_01,iVar5))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," &a, ",5);
    iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,*(char **)CONCAT44(extraout_var_02,iVar5),
                        ((undefined8 *)CONCAT44(extraout_var_02,iVar5))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," &b) {",6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  piVar1 = &(local_48->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"using ::std::swap;",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pptVar7 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (pptVar7 != local_38) {
    bVar4 = 0;
    do {
      bVar3 = bVar4;
      ptVar2 = *pptVar7;
      bVar8 = ptVar2->req_ != T_REQUIRED;
      iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_05,iVar5));
      if (iVar5 == 0) {
LAB_00185417:
        t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"swap(a1.",8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", a2.",5);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      else {
        iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
        iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_06,iVar5));
        if (iVar5 == 0) goto LAB_00185417;
        t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"swap(a.",7);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", b.",4);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(ptVar2->name_)._M_dataplus._M_p,(ptVar2->name_)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      pptVar7 = pptVar7 + 1;
      bVar4 = bVar3 | bVar8;
    } while (pptVar7 != local_38);
    if ((bool)(bVar3 | bVar8)) {
      iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
      iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_07,iVar5));
      if (iVar5 == 0) {
LAB_0018556d:
        t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"swap(a1.__isset, a2.__isset);",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      else {
        iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
        iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_08,iVar5));
        if (iVar5 == 0) goto LAB_0018556d;
        t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"swap(a.__isset, b.__isset);",0x1b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
  }
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) goto LAB_00185798;
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_09,iVar5));
  if (iVar5 == 0) {
LAB_001856d6:
    t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(void) a1;",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(void) a2;",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    iVar5 = std::__cxx11::string::compare((char *)CONCAT44(extraout_var_10,iVar5));
    if (iVar5 == 0) goto LAB_001856d6;
    t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(void) a;",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_68,(t_generator *)local_48);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_40,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(void) b;",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
LAB_00185798:
  poVar6 = local_40;
  t_oop_generator::scope_down(&local_48->super_t_oop_generator,local_40);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_swap(ostream& out, t_struct* tstruct) {
  if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
    out << indent() << "void swap(" << tstruct->get_name() << " &a1, " << tstruct->get_name()
        << " &a2) {" << endl; 
  } else {
    out << indent() << "void swap(" << tstruct->get_name() << " &a, " << tstruct->get_name()
        << " &b) {" << endl;
  }

  indent_up();

  // Let argument-dependent name lookup find the correct swap() function to
  // use based on the argument types.  If none is found in the arguments'
  // namespaces, fall back to ::std::swap().
  out << indent() << "using ::std::swap;" << endl;

  bool has_nonrequired_fields = false;
  const vector<t_field*>& fields = tstruct->get_members();
  for (auto tfield : fields) {
    if (tfield->get_req() != t_field::T_REQUIRED) {
      has_nonrequired_fields = true;
    }

    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "swap(a1." << tfield->get_name() << ", a2." << tfield->get_name() << ");"
          << endl;
    } else {
      out << indent() << "swap(a." << tfield->get_name() << ", b." << tfield->get_name() << ");"
          << endl;
    }
  }

  if (has_nonrequired_fields) {
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "swap(a1.__isset, a2.__isset);" << endl; 
    } else {
      out << indent() << "swap(a.__isset, b.__isset);" << endl;
    }
  }

  // handle empty structs
  if (fields.size() == 0) {
    if (tstruct->get_name() == "a" || tstruct->get_name() == "b") {
      out << indent() << "(void) a1;" << endl;
      out << indent() << "(void) a2;" << endl;
    } else {
      out << indent() << "(void) a;" << endl;
      out << indent() << "(void) b;" << endl;
    }
  }

  scope_down(out);
  out << endl;
}